

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O3

tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
 __thiscall
pstore::http::
socket_read<pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>&,pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(&)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (http *this,
          buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
          *reader,_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *sender,
          reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
          io,not_null<pstore::http::ws_command_*> command)

{
  uint uVar1;
  long lVar2;
  undefined8 *puVar3;
  descriptor<pstore::details::posix_descriptor_traits> dVar4;
  bool bVar5;
  tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>
  *ptVar6;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_00;
  _Head_base<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_false>
  extraout_RDX;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  *peVar7;
  close_status_code cVar8;
  not_null<pstore::http::ws_command_*> wsp;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  undefined8 *puVar9;
  long *in_FS_OFFSET;
  error_code eVar10;
  error_code eVar11;
  tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  tVar12;
  error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_frame>
  eo;
  long *local_178 [2];
  long local_168 [2];
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_158;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_140;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_128;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_110;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_f8;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_e0;
  error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_frame>
  local_c8;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_98;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_80;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_68;
  index_type local_50;
  descriptor<pstore::details::posix_descriptor_traits> local_48;
  extent_type<_1L> local_40 [2];
  
  wsp.ptr_ = command.ptr_;
  read_frame<pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (&local_c8,(http *)reader,
             (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)io._M_data,
             (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
              )io._M_data);
  if (local_c8.has_error_ == true) {
    eVar10 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
             ::get_error(&local_c8);
    (**(code **)(*(long *)eVar10._M_cat + 0x20))(local_178,eVar10._M_cat,eVar10._M_value);
    pstore::details::log_destinations::__tls_init();
    cVar8 = (close_status_code)wsp.ptr_;
    lVar2 = *in_FS_OFFSET;
    if (*(long *)(lVar2 + -8) != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar9 = *(undefined8 **)(lVar2 + -8);
      cVar8 = (close_status_code)wsp.ptr_;
      puVar3 = (undefined8 *)puVar9[1];
      for (puVar9 = (undefined8 *)*puVar9; puVar9 != puVar3; puVar9 = puVar9 + 1) {
        (**(code **)(*(long *)*puVar9 + 0x50))((long *)*puVar9,3,"Error: ",local_178[0]);
        cVar8 = (close_status_code)wsp.ptr_;
      }
    }
    if (local_178[0] != local_168) {
      operator_delete(local_178[0],local_168[0] + 1);
    }
    eVar10 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
             ::get_error(&local_c8);
    eVar11 = make_error_code(unmasked_frame);
    if (eVar10._M_value == eVar11._M_value && eVar10._M_cat == eVar11._M_cat) {
      send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_e0,(http *)sender,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)io._M_data,
                 (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  )0x3ea,cVar8);
      if (local_e0.has_error_ == false) {
        peVar7 = &local_e0;
        goto LAB_0012635f;
      }
      peVar7 = &local_e0;
      goto LAB_0012629f;
    }
    eVar11 = make_error_code(reserved_bit_set);
    if (eVar10._M_value != eVar11._M_value || eVar10._M_cat != eVar11._M_cat) {
      send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                (&local_110,(http *)sender,
                 (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                  *)io._M_data,
                 (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  )0x3ee,cVar8);
      if (local_110.has_error_ == false) {
        peVar7 = &local_110;
        goto LAB_0012635f;
      }
      peVar7 = &local_110;
      goto LAB_0012629f;
    }
    send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_f8,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                )0x3ea,cVar8);
    if (local_f8.has_error_ != false) {
      peVar7 = &local_f8;
      goto LAB_0012629f;
    }
    peVar7 = &local_f8;
LAB_0012635f:
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (peVar7);
    goto LAB_00126364;
  }
  ptVar6 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>
           ::
           value_storage_impl<pstore::error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>const&,std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>const>
                     (&local_c8);
  io._M_data = (ptVar6->
               super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>
               ).
               super__Head_base<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_false>
               ._M_head_impl._M_data;
  io_00._M_data =
       (descriptor<pstore::details::posix_descriptor_traits> *)
       error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>
       ::
       value_storage_impl<pstore::error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>const&,std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>const>
                 (&local_c8);
  uVar1 = (io_00._M_data)->fd_;
  cVar8 = (close_status_code)wsp.ptr_;
  if (((uVar1 & 8) != 0) &&
     (((io_00._M_data)->field_0x4 != '\x01' ||
      (0x7d < (ulong)((long)io_00._M_data[2] - (long)io_00._M_data[1]))))) {
    send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_128,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                )0x3ea,cVar8);
    if (local_128.has_error_ == false) {
      peVar7 = &local_128;
      goto LAB_0012635f;
    }
    peVar7 = &local_128;
    goto LAB_0012629f;
  }
  switch(uVar1) {
  case 0:
    if (((command.ptr_)->op & close) == continuation) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&(command.ptr_)->payload,
                 ((command.ptr_)->payload).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,io_00._M_data[1],io_00._M_data[2]);
      bVar5 = check_message_complete<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                        (sender,io,(frame *)io_00._M_data,&(command.ptr_)->op,
                         &(command.ptr_)->payload);
LAB_00126403:
      if (bVar5 == false) goto LAB_00126364;
      break;
    }
    send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_68,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                )0x3ea,cVar8);
    peVar7 = &local_68;
    goto LAB_001263cc;
  case 1:
  case 2:
    if (((command.ptr_)->op == unknown) &&
       (((command.ptr_)->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        ((command.ptr_)->payload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(command.ptr_)->payload,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(io_00._M_data + 1));
      (command.ptr_)->op = (io_00._M_data)->fd_;
      bVar5 = check_message_complete<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                        (sender,io,(frame *)io_00._M_data,&(command.ptr_)->op,
                         &(command.ptr_)->payload);
      goto LAB_00126403;
    }
    send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_140,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                )0x3ea,cVar8);
    if (local_140.has_error_ == false) {
      peVar7 = &local_140;
      goto LAB_0012635f;
    }
    peVar7 = &local_140;
    goto LAB_0012629f;
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    send_close_frame<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_158,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                )0x3ea,cVar8);
    if (local_158.has_error_ == false) {
      peVar7 = &local_158;
      goto LAB_0012635f;
    }
    peVar7 = &local_158;
LAB_0012629f:
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
    ::
    error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
              (peVar7);
    goto LAB_00126364;
  case 8:
    close_message<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_80,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,io_00,(frame *)wsp.ptr_);
    peVar7 = &local_80;
LAB_001263cc:
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or(peVar7);
LAB_00126364:
    *this = (http)0x1;
    goto LAB_00126367;
  case 9:
    dVar4 = io_00._M_data[1];
    pstore::gsl::details::extent_type<-1L>::extent_type
              (local_40,(long)io_00._M_data[2] - (long)dVar4);
    local_50 = local_40[0].size_;
    local_48 = dVar4;
    pong<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_98,(http *)sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)io._M_data,(descriptor<pstore::details::posix_descriptor_traits> *)&local_50,
               (span<const_unsigned_char,__1L> *)wsp.ptr_);
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or(&local_98);
    break;
  case 10:
    break;
  default:
    if (uVar1 == 0xff) {
      assert_failed("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/ws_server.hpp"
                    ,0x237);
    }
  }
  *this = (http)0x0;
LAB_00126367:
  *(descriptor<pstore::details::posix_descriptor_traits> **)(this + 8) = io._M_data;
  error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
  ::~error_or(&local_c8);
  tVar12.
  super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  .
  super__Head_base<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_false>
  ._M_head_impl._M_data = extraout_RDX._M_head_impl._M_data;
  tVar12.
  super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  ._0_8_ = this;
  return (tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
          )tVar12.
           super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_bool>
  ;
}

Assistant:

std::tuple<IO, bool> socket_read (Reader && reader, Sender && sender, IO io,
                                          gsl::not_null<ws_command *> const command) {
            error_or_n<IO, frame> const eo = read_frame (reader, io);
            if (!eo) {
                log (logger::priority::error, "Error: ", eo.get_error ().message ());
                auto const error = eo.get_error ();
                if (error == make_error_code (ws_error::unmasked_frame)) {
                    // "The server MUST close the connection upon receiving a frame that is not
                    // masked.  In this case, a server MAY send a Close frame with a status code
                    // of 1002 (protocol error)."
                    send_close_frame (sender, io, close_status_code::protocol_error);
                } else if (error == make_error_code (ws_error::reserved_bit_set)) {
                    send_close_frame (sender, io, close_status_code::protocol_error);
                } else {
                    send_close_frame (sender, io, close_status_code::abnormal_closure);
                }
                return std::tuple<IO, bool>{std::move (io), true};
            }

            io = get<0> (eo);
            frame const & wsp = get<1> (eo);

            // "All control frames MUST have a payload length of 125 bytes or less and MUST
            // NOT be fragmented."
            if (is_control_frame_opcode (wsp.op) && (!wsp.fin || wsp.payload.size () > 125)) {
                send_close_frame (sender, io, close_status_code::protocol_error);
                return std::tuple<IO, bool>{std::move (io), true};
            }

            switch (wsp.op) {
            case opcode::continuation:
                if (is_control_frame_opcode (command->op)) {
                    send_close_frame (sender, io, close_status_code::protocol_error);
                    return std::tuple<IO, bool>{std::move (io), true};
                }
                command->payload.insert (std::end (command->payload), std::begin (wsp.payload),
                                         std::end (wsp.payload));
                if (!check_message_complete (sender, io, wsp, command->op, command->payload)) {
                    return std::tuple<IO, bool>{std::move (io), true};
                }
                break;

            // Data frame opcodes.
            case opcode::text:
            case opcode::binary:
                // We didn't see a FIN frame before a new data frame.
                if (command->op != opcode::unknown || !command->payload.empty ()) {
                    send_close_frame (sender, io, close_status_code::protocol_error);
                    return std::tuple<IO, bool>{std::move (io), true};
                }

                command->payload = std::move (wsp.payload);
                command->op = wsp.op;
                if (!check_message_complete (sender, io, wsp, command->op, command->payload)) {
                    return std::tuple<IO, bool>{std::move (io), true};
                }
                break;

            case opcode::reserved_nc_1:
            case opcode::reserved_nc_2:
            case opcode::reserved_nc_3:
            case opcode::reserved_nc_4:
            case opcode::reserved_nc_5:
            case opcode::reserved_control_1:
            case opcode::reserved_control_2:
            case opcode::reserved_control_3:
            case opcode::reserved_control_4:
            case opcode::reserved_control_5:
                send_close_frame (sender, io, close_status_code::protocol_error);
                return std::tuple<IO, bool>{std::move (io), true};

            case opcode::close:
                close_message (sender, io, wsp);
                return std::tuple<IO, bool>{std::move (io), true};

            case opcode::ping: pong (sender, io, gsl::make_span (wsp.payload)); break;

            case opcode::pong:
                // TODO: A reply to a ping that we sent.
                break;

            case opcode::unknown: PSTORE_ASSERT (0); break;
            }
            return std::tuple<IO, bool>{std::move (io), false};
        }